

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O1

void __thiscall
Ptex::v2_2::PtexReader::readMetaDataBlock
          (PtexReader *this,MetaData *metadata,FilePos pos,int zipsize,int memsize,
          size_t *metaDataMemUsed)

{
  byte *key;
  byte *pbVar1;
  byte bVar2;
  byte datatype;
  uint datasize;
  int zipsize_00;
  bool bVar3;
  byte *pbVar4;
  char *__dest;
  byte *pbVar5;
  ulong __n;
  byte abStack_58 [8];
  byte *local_50;
  byte *local_48;
  Entry *local_40;
  int local_34;
  
  local_40 = (Entry *)CONCAT44(local_40._4_4_,zipsize);
  seek(this,pos);
  if (memsize < 0x4001) {
    pbVar4 = abStack_58 + -((long)memsize + 0xfU & 0xfffffffffffffff0);
    pbVar5 = pbVar4;
  }
  else {
    pbVar4 = (byte *)operator_new__((ulong)(uint)memsize);
    pbVar5 = abStack_58;
  }
  zipsize_00 = (int)local_40;
  local_48 = pbVar4;
  local_34 = memsize;
  pbVar5[-8] = 0x85;
  pbVar5[-7] = 0x2b;
  pbVar5[-6] = 0x11;
  pbVar5[-5] = 0;
  pbVar5[-4] = 0;
  pbVar5[-3] = 0;
  pbVar5[-2] = 0;
  pbVar5[-1] = 0;
  bVar3 = readZipBlock(this,pbVar4,zipsize_00,memsize);
  if ((bVar3) && (0 < local_34)) {
    local_50 = local_48 + memsize;
    pbVar4 = local_48;
    do {
      key = pbVar4 + 1;
      bVar2 = *pbVar4;
      pbVar1 = pbVar4 + bVar2;
      *pbVar1 = 0;
      datatype = pbVar1[1];
      datasize = *(uint *)(pbVar1 + 2);
      __n = (ulong)datasize;
      pbVar4 = pbVar4 + __n + bVar2 + 6;
      pbVar5[-8] = 0xe9;
      pbVar5[-7] = 0x2b;
      pbVar5[-6] = 0x11;
      pbVar5[-5] = 0;
      pbVar5[-4] = 0;
      pbVar5[-3] = 0;
      pbVar5[-2] = 0;
      pbVar5[-1] = 0;
      local_40 = MetaData::newEntry(metadata,bVar2 - 1,(char *)key,datatype,datasize,metaDataMemUsed
                                   );
      pbVar5[-8] = 0xf5;
      pbVar5[-7] = 0x2b;
      pbVar5[-6] = 0x11;
      pbVar5[-5] = 0;
      pbVar5[-4] = 0;
      pbVar5[-3] = 0;
      pbVar5[-2] = 0;
      pbVar5[-1] = 0;
      __dest = (char *)operator_new__(__n);
      local_40->data = __dest;
      pbVar5[-8] = 0xb;
      pbVar5[-7] = 0x2c;
      pbVar5[-6] = 0x11;
      pbVar5[-5] = 0;
      pbVar5[-4] = 0;
      pbVar5[-3] = 0;
      pbVar5[-2] = 0;
      pbVar5[-1] = 0;
      memcpy(__dest,pbVar1 + 6,__n);
      *metaDataMemUsed = *metaDataMemUsed + __n;
    } while (pbVar4 < local_50);
  }
  pbVar4 = local_48;
  if (0x4000 < local_34) {
    pbVar5[-8] = 0x2c;
    pbVar5[-7] = 0x2c;
    pbVar5[-6] = 0x11;
    pbVar5[-5] = 0;
    pbVar5[-4] = 0;
    pbVar5[-3] = 0;
    pbVar5[-2] = 0;
    pbVar5[-1] = 0;
    operator_delete__(pbVar4);
  }
  return;
}

Assistant:

void PtexReader::readMetaDataBlock(MetaData* metadata, FilePos pos, int zipsize, int memsize, size_t& metaDataMemUsed)
{
    seek(pos);
    // read from file
    bool useNew = memsize > AllocaMax;
    char* buff = useNew ? new char[memsize] : (char*)alloca(memsize);

    if (readZipBlock(buff, zipsize, memsize)) {
        // unpack data entries
        char* ptr = buff;
        char* end = ptr + memsize;
        while (ptr < end) {
            uint8_t keysize = *ptr++;
            char* key = (char*)ptr; ptr += keysize;
            key[keysize-1] = '\0';
            uint8_t datatypeval = *ptr++;
            uint32_t datasize; memcpy(&datasize, ptr, sizeof(datasize));
            ptr += sizeof(datasize);
            char* data = ptr; ptr += datasize;
            metadata->addEntry((uint8_t)(keysize-1), key, datatypeval, datasize, data, metaDataMemUsed);
        }
    }
    if (useNew) delete [] buff;
}